

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polylinecurve.cpp
# Opt level: O1

bool __thiscall ON_PolylineCurve::ChangeDimension(ON_PolylineCurve *this,int desired_dimension)

{
  double dVar1;
  uint uVar2;
  ON_3dPoint *pOVar3;
  int iVar4;
  long lVar5;
  
  if (((desired_dimension & 0xfffffffeU) == 2) && (this->m_dim != desired_dimension)) {
    ON_Curve::DestroyCurveTree(&this->super_ON_Curve);
    uVar2 = (this->m_pline).super_ON_3dPointArray.super_ON_SimpleArray<ON_3dPoint>.m_count;
    if (desired_dimension == 2) {
      iVar4 = 2;
      if (0 < (int)uVar2) {
        pOVar3 = (this->m_pline).super_ON_3dPointArray.super_ON_SimpleArray<ON_3dPoint>.m_a;
        dVar1 = pOVar3->x;
        if ((dVar1 != -1.23432101234321e+308) || (NAN(dVar1))) {
          lVar5 = 0;
          do {
            *(undefined8 *)((long)&pOVar3->z + lVar5) = 0;
            lVar5 = lVar5 + 0x18;
          } while ((ulong)uVar2 * 0x18 != lVar5);
        }
      }
    }
    else {
      iVar4 = 3;
      if (0 < (int)uVar2) {
        pOVar3 = (this->m_pline).super_ON_3dPointArray.super_ON_SimpleArray<ON_3dPoint>.m_a;
        if ((((pOVar3->x != -1.23432101234321e+308) || (NAN(pOVar3->x))) &&
            (pOVar3->z == -1.23432101234321e+308)) && (!NAN(pOVar3->z))) {
          lVar5 = 0;
          do {
            *(undefined8 *)((long)&pOVar3->z + lVar5) = 0;
            lVar5 = lVar5 + 0x18;
          } while ((ulong)uVar2 * 0x18 != lVar5);
        }
      }
    }
    this->m_dim = iVar4;
  }
  return (desired_dimension & 0xfffffffeU) == 2;
}

Assistant:

bool ON_PolylineCurve::ChangeDimension( int desired_dimension )
{
  bool rc = (desired_dimension>=2 && desired_dimension<=3);

  if ( rc && m_dim != desired_dimension )
  {
  	DestroyCurveTree();
    int i, count = m_pline.Count();
    if ( 2 == desired_dimension )
    {
      if ( count > 0 )
      {
        // 7 April 2003 Dale Lear:
        //   If x coord of first point is set, then
        //   zero all z coords.  
        if ( ON_UNSET_VALUE != m_pline[0].x )
        {
          for ( i = 0; i < count; i++ )
            m_pline[i].z = 0.0;
        }
      }
      m_dim = 2;
    }
    else 
    {
      if ( count > 0 )
      {
        // 7 April 2003 Dale Lear:
        //   If first point x coord is set and z is unset, then
        //   zero all z coords.  
        if ( ON_UNSET_VALUE != m_pline[0].x && ON_UNSET_VALUE == m_pline[0].z )
        {
          for ( i = 0; i < count; i++ )
            m_pline[i].z = 0.0;
        }
      }
      m_dim = 3;
    }
  }

  return rc;
}